

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann::KalbachMann
          (KalbachMann *this,double energy,long nd,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *data)

{
  pointer paVar1;
  pointer paVar2;
  _Vector_base<double,_std::allocator<double>_> local_88;
  double local_70;
  ListRecord local_68;
  
  paVar1 = (data->
           super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar2 = (data->
           super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_70 = energy;
  generateList<std::array<double,4ul>>
            ((vector<double,_std::allocator<double>_> *)&local_88,(KalbachMann *)data,data);
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)((long)paVar2 - (long)paVar1 >> 5);
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)local_88._M_impl.super__Vector_impl_data._M_finish -
       (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = 2;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = local_70;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  local_68.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_88._M_impl.super__Vector_impl_data._M_start;
  local_68.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_88._M_impl.super__Vector_impl_data._M_finish;
  local_68.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_88._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       nd;
  KalbachMann(this,&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_68.data.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

KalbachMann( double energy, long nd,
             std::vector< std::array< double, 4 > >&& data )
  try : KalbachMann( ListRecord( 0.0, energy, nd, 2, data.size(),
                                 generateList( std::move( data ) ) ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing Kalbach-Mann distribution "
               "data (LAW=1 LANG=2)" );
    throw;
  }